

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O1

_Bool has_patched_distance(pfdistances_patched *distances,loc_conflict grid)

{
  wchar_t wVar1;
  byte bVar2;
  wchar_t wVar3;
  
  if (((((long)grid < 0) || (wVar3 = grid.x, wVar3 < L'\0')) || (distances->height <= grid.y)) ||
     (distances->width <= wVar3)) {
    __assert_fail("grid.y >= 0 && grid.y < distances->height && grid.x >= 0 && grid.x < distances->width"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                  ,699,"_Bool has_patched_distance(const struct pfdistances_patched *, struct loc)")
    ;
  }
  bVar2 = (byte)distances->patch_shift;
  wVar1 = (uint)grid.y >> (bVar2 & 0x1f);
  if (distances->npatchy <= wVar1) {
    __assert_fail("patchy >= 0 && patchy < distances->npatchy",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                  ,0x2bd,
                  "_Bool has_patched_distance(const struct pfdistances_patched *, struct loc)");
  }
  wVar3 = (uint)wVar3 >> (bVar2 & 0x1f);
  if (wVar3 < distances->npatchx) {
    return distances->patches[(uint)wVar1][(uint)wVar3] != (int *)0x0;
  }
  __assert_fail("patchx >= 0 && patchx < distances->npatchx",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                ,0x2bf,"_Bool has_patched_distance(const struct pfdistances_patched *, struct loc)")
  ;
}

Assistant:

static bool has_patched_distance(const struct pfdistances_patched *distances,
		struct loc grid)
{
	int patchy, patchx;

	assert(grid.y >= 0 && grid.y < distances->height
		&& grid.x >= 0 && grid.x < distances->width);
	patchy = grid.y >> distances->patch_shift;
	assert(patchy >= 0 && patchy < distances->npatchy);
	patchx = grid.x >> distances->patch_shift;
	assert(patchx >= 0 && patchx < distances->npatchx);
	return distances->patches[patchy][patchx];
}